

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O2

string * __thiscall
FileParse::enumToString<BSDFData::ScatteringDataType,4ul>
          (string *__return_storage_ptr__,FileParse *this,ScatteringDataType value,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *values)

{
  undefined4 in_register_00000014;
  allocator<char> local_9;
  
  if ((uint)this < 4) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT44(in_register_00000014,value) + ((ulong)this & 0xffffffff) * 0x20));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string enumToString(EnumType value, const std::array<std::string, N> & values)
    {
        const auto index{static_cast<std::size_t>(value)};
        if(index < values.size())
        {
            return values[index];
        }
        return "Unknown";
    }